

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

CharClass * __thiscall re2::CharClass::Negate(CharClass *this)

{
  int iVar1;
  iterator pRVar2;
  iterator pRVar3;
  RuneRange local_38;
  RuneRange local_30;
  iterator local_28;
  iterator it;
  int nextlo;
  int n;
  CharClass *cc;
  CharClass *this_local;
  
  cc = this;
  _nextlo = New(*(int *)(this + 0x10) + 1);
  *_nextlo = (CharClass)((byte)*this & 1);
  *(int *)(_nextlo + 4) = 0x110000 - *(int *)(this + 4);
  it._4_4_ = 0;
  it._0_4_ = 0;
  local_28 = begin(this);
  while( true ) {
    pRVar2 = local_28;
    pRVar3 = end(this);
    if (pRVar2 == pRVar3) break;
    if (local_28->lo == (int)it) {
      iVar1 = local_28->hi;
    }
    else {
      RuneRange::RuneRange(&local_30,(int)it,local_28->lo + -1);
      *(RuneRange *)(*(long *)(_nextlo + 8) + (long)it._4_4_ * 8) = local_30;
      iVar1 = local_28->hi;
      it._4_4_ = it._4_4_ + 1;
    }
    it._0_4_ = iVar1 + 1;
    local_28 = local_28 + 1;
  }
  if ((int)it < 0x110000) {
    RuneRange::RuneRange(&local_38,(int)it,0x10ffff);
    *(RuneRange *)(*(long *)(_nextlo + 8) + (long)it._4_4_ * 8) = local_38;
    it._4_4_ = it._4_4_ + 1;
  }
  *(int *)(_nextlo + 0x10) = it._4_4_;
  return _nextlo;
}

Assistant:

CharClass* CharClass::Negate() {
  CharClass* cc = CharClass::New(nranges_+1);
  cc->folds_ascii_ = folds_ascii_;
  cc->nrunes_ = Runemax + 1 - nrunes_;
  int n = 0;
  int nextlo = 0;
  for (CharClass::iterator it = begin(); it != end(); ++it) {
    if (it->lo == nextlo) {
      nextlo = it->hi + 1;
    } else {
      cc->ranges_[n++] = RuneRange(nextlo, it->lo - 1);
      nextlo = it->hi + 1;
    }
  }
  if (nextlo <= Runemax)
    cc->ranges_[n++] = RuneRange(nextlo, Runemax);
  cc->nranges_ = n;
  return cc;
}